

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint val)

{
  uint *__s;
  uint uVar1;
  uint *puVar2;
  
  __s = this->_data;
  if (this->_spectrum != 0 &&
      ((this->_depth != 0 && this->_height != 0) && (this->_width != 0 && __s != (uint *)0x0))) {
    uVar1 = this->_depth * this->_spectrum * this->_height * this->_width;
    if (val == 0) {
      memset(__s,0,(ulong)uVar1 << 2);
    }
    else if (uVar1 != 0) {
      puVar2 = __s + uVar1;
      do {
        puVar2[-1] = val;
        puVar2 = puVar2 + -1;
      } while (__s < puVar2);
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,size()*sizeof(T));
      return *this;
    }